

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::NamedBase::AddDescriptionPostfix
          (NamedBase *this,string *dest,bool isManual,string *manual,bool isGenerated,
          string *generated,string *str)

{
  byte bVar1;
  string *generated_local;
  bool isGenerated_local;
  string *manual_local;
  bool isManual_local;
  string *dest_local;
  NamedBase *this_local;
  
  if ((isManual) && (bVar1 = std::__cxx11::string::empty(), (bVar1 & 1) == 0)) {
    std::__cxx11::string::operator+=((string *)dest,(string *)str);
    std::__cxx11::string::operator+=((string *)dest,(string *)manual);
  }
  else if (((!isManual) && (isGenerated)) &&
          (bVar1 = std::__cxx11::string::empty(), (bVar1 & 1) == 0)) {
    std::__cxx11::string::operator+=((string *)dest,(string *)str);
    std::__cxx11::string::operator+=((string *)dest,(string *)generated);
  }
  return;
}

Assistant:

void AddDescriptionPostfix(std::string &dest, const bool isManual, const std::string &manual, bool isGenerated, const std::string &generated, const std::string &str) const
            {
                if (isManual && !manual.empty())
                {
                    dest += str;
                    dest += manual;
                }
                else if (!isManual && isGenerated && !generated.empty())
                {
                    dest += str;
                    dest += generated;
                }
            }